

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

string * __thiscall toml::source_location::last_line_abi_cxx11_(source_location *this)

{
  size_type sVar1;
  out_of_range *this_00;
  const_reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  sVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI + 4);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"toml::source_location::first_line: `lines` is empty");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pvVar2 = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(in_RDI);
  return (string *)pvVar2;
}

Assistant:

TOML11_INLINE std::string const& source_location::last_line() const
{
    if(this->line_str_.size() == 0)
    {
        throw std::out_of_range("toml::source_location::first_line: `lines` is empty");
    }
    return this->line_str_.back();
}